

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEEE754PluginTest.cpp
# Opt level: O0

void __thiscall
TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test::
TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test
          (TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test *this)

{
  TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test *this_local;
  
  memset(this,0,0x60);
  TEST_GROUP_CppUTestGroupFE_with_Plugin::TEST_GROUP_CppUTestGroupFE_with_Plugin
            (&this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin);
  (this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test_003603f0;
  return;
}

Assistant:

TEST(FE_with_Plugin, should_not_fail_again_when_test_has_already_failed)
{
    fixture.setTestFunction(set_everything_but_already_failed);
    fixture.runAllTests();
    CHECK(IEEE754ExceptionsPlugin::checkIeee754OverflowExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754UnderflowExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754InexactExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754DivByZeroExceptionFlag());
    LONGS_EQUAL(1, fixture.getCheckCount());
    LONGS_EQUAL(1, fixture.getFailureCount());
}